

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

int Inta_ManProofRecordOne(Inta_Man_t *p,Sto_Cls_t *pClause)

{
  long lVar1;
  uint uVar2;
  Sto_Cls_t *pSVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar2 = *(uint *)&pClause->field_0x1c;
  if ((uVar2 & 0x7fffff8) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2d5,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if ((uVar2 & 2) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2d9,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2da,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  uVar2 = uVar2 >> 3 & 0xffffff;
  if (uVar2 != 0) {
    uVar8 = 0;
    do {
      iVar7 = *(int *)((long)&pClause[1].pNext + uVar8 * 4);
      if (p->pAssigns[iVar7 >> 1] == iVar7) {
        return 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  if ((*(uint *)&pClause->field_0x1c & 0x7fffff8) != 0) {
    uVar8 = 0;
    do {
      uVar2 = *(uint *)((long)&pClause[1].pNext + uVar8 * 4);
      uVar4 = uVar2 ^ 1;
      iVar7 = (int)uVar2 >> 1;
      uVar2 = p->pAssigns[iVar7];
      if (uVar2 == 0xffffffff) {
        p->pAssigns[iVar7] = uVar4;
        p->pReasons[iVar7] = (Sto_Cls_t *)0x0;
        iVar7 = p->nTrailSize;
        p->nTrailSize = iVar7 + 1;
        p->pTrail[iVar7] = uVar4;
      }
      else if (uVar2 != uVar4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                      ,0x2e6,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff));
  }
  pSVar3 = Inta_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2ee,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  uVar4 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar2 = *(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff;
  if (uVar2 <= uVar4) {
    uVar8 = 0;
    if (uVar2 != 0) {
      do {
        uVar10 = 0;
        if (uVar4 != 0) {
          uVar10 = 0;
          do {
            if (*(int *)((long)&pSVar3[1].pNext + uVar8 * 4) ==
                *(int *)((long)&pClause[1].pNext + uVar10 * 4)) goto LAB_008d4436;
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
          uVar10 = (ulong)uVar4;
        }
LAB_008d4436:
        if ((uint)uVar10 == uVar4) goto LAB_008d4444;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar2);
      uVar8 = (ulong)uVar2;
    }
LAB_008d4444:
    if ((uint)uVar8 == uVar2) {
      iVar7 = p->nRootSize;
      lVar6 = (long)p->nTrailSize;
      if (iVar7 < p->nTrailSize) {
        do {
          lVar1 = lVar6 + -1;
          lVar6 = lVar6 + -1;
          iVar9 = p->pTrail[lVar1] >> 1;
          p->pReasons[iVar9] = (Sto_Cls_t *)0x0;
          p->pAssigns[iVar9] = -1;
        } while (iVar7 < lVar6);
      }
      p->nTrailSize = iVar7;
      return 1;
    }
  }
  Inta_ManProofTraceOne(p,pSVar3,pClause);
  iVar7 = p->nRootSize;
  lVar6 = (long)p->nTrailSize;
  if (iVar7 < p->nTrailSize) {
    do {
      lVar1 = lVar6 + -1;
      lVar6 = lVar6 + -1;
      iVar9 = p->pTrail[lVar1] >> 1;
      p->pReasons[iVar9] = (Sto_Cls_t *)0x0;
      p->pAssigns[iVar9] = -1;
    } while (iVar7 < lVar6);
  }
  p->nTrailSize = iVar7;
  uVar2 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  if (1 < uVar2) {
    uVar2 = *(uint *)&pClause[1].pNext;
    if ((-1 < (int)uVar2) && ((int)uVar2 >> 1 < p->pCnf->nVars)) {
      pClause->pNext0 = p->pWatches[(ulong)uVar2 ^ 1];
      p->pWatches[(ulong)uVar2 ^ 1] = pClause;
      uVar4 = *(uint *)((long)&pClause[1].pNext + 4);
      if ((-1 < (int)uVar4) && ((int)uVar4 >> 1 < p->pCnf->nVars)) {
        (&pClause->pNext0)[uVar2 != uVar4] = p->pWatches[(ulong)uVar4 ^ 1];
        p->pWatches[uVar4 ^ 1] = pClause;
        return 1;
      }
    }
    __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x15a,"void Inta_ManWatchClause(Inta_Man_t *, Sto_Cls_t *, lit)");
  }
  if (uVar2 != 1) {
    __assert_fail("pClause->nLits == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x314,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  iVar7 = *(int *)&pClause[1].pNext;
  iVar5 = iVar7 >> 1;
  iVar9 = p->pAssigns[iVar5];
  if (iVar9 == -1) {
    p->pAssigns[iVar5] = iVar7;
    p->pReasons[iVar5] = pClause;
    iVar9 = p->nTrailSize;
    p->nTrailSize = iVar9 + 1;
    p->pTrail[iVar9] = iVar7;
  }
  else if (iVar9 != iVar7) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x319,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  pSVar3 = Inta_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    p->nRootSize = p->nTrailSize;
    return 1;
  }
  Inta_ManProofTraceOne(p,pSVar3,p->pCnf->pEmpty);
  return 0;
}

Assistant:

int Inta_ManProofRecordOne( Inta_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
            return 1;

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Inta_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Inta_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    } 

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Inta_ManCancelUntil( p, p->nRootSize );
            return 1;
        }
    }

    // construct the proof
    Inta_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Inta_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Inta_ManWatchClause( p, pClause, pClause->pLits[0] );
        Inta_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Inta_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Inta_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // construct the proof
        Inta_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}